

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

int __thiscall ncnn::ParamDict::load_param_mem(ParamDict *this,char **mem)

{
  int *piVar1;
  Allocator *pAVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  char *pcVar9;
  Mat *pMVar10;
  long lVar11;
  size_t sVar12;
  int len;
  int id;
  int _b_1;
  int _b;
  int local_54;
  int local_50;
  int local_4c;
  int local_48 [6];
  
  clear(this);
  iVar5 = 0;
  local_50 = 0;
  local_48[0] = 0;
  iVar4 = __isoc99_sscanf(*mem,"%d=%n",&local_50,local_48);
  pcVar9 = *mem + local_48[0];
  *mem = pcVar9;
  if (iVar4 == 1 && 0 < (long)local_48[0]) {
    while (local_50 < -0x5b03) {
      local_50 = -0x5b04 - local_50;
      local_54 = 0;
      local_48[0] = 0;
      iVar5 = __isoc99_sscanf(pcVar9,"%d%n",&local_54,local_48);
      iVar4 = local_54;
      *mem = *mem + local_48[0];
      if ((iVar5 != 1) || (local_48[0] < 1)) {
        load_param_mem();
        goto LAB_00133580;
      }
      lVar8 = (long)local_50;
      if ((((this->params[lVar8].v.dims != 1) || (this->params[lVar8].v.w != local_54)) ||
          (this->params[lVar8].v.elemsize != 4)) ||
         (this->params[lVar8].v.allocator != (Allocator *)0x0)) {
        pMVar10 = &this->params[lVar8].v;
        piVar1 = this->params[lVar8].v.refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pAVar2 = this->params[lVar8].v.allocator;
            if (pAVar2 == (Allocator *)0x0) {
              if (pMVar10->data != (void *)0x0) {
                free(*(void **)((long)pMVar10->data + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar2 + 8))();
            }
          }
        }
        sVar12 = (size_t)iVar4;
        pMVar10->data = (void *)0x0;
        this->params[lVar8].v.refcount = (int *)0x0;
        this->params[lVar8].v.elemsize = 0;
        this->params[lVar8].v.cstep = 0;
        this->params[lVar8].v.dims = 0;
        this->params[lVar8].v.w = 0;
        this->params[lVar8].v.h = 0;
        this->params[lVar8].v.c = 0;
        this->params[lVar8].v.elemsize = 4;
        this->params[lVar8].v.allocator = (Allocator *)0x0;
        this->params[lVar8].v.dims = 1;
        this->params[lVar8].v.w = iVar4;
        this->params[lVar8].v.h = 1;
        this->params[lVar8].v.c = 1;
        this->params[lVar8].v.cstep = sVar12;
        if (iVar4 != 0) {
          pvVar6 = malloc(sVar12 * 4 + 0x1c);
          pvVar7 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar7 - 8) = pvVar6;
          pMVar10->data = pvVar7;
          piVar1 = (int *)((long)pvVar7 + sVar12 * 4);
          this->params[lVar8].v.refcount = piVar1;
          *piVar1 = 1;
        }
      }
      if (0 < local_54) {
        lVar11 = 0;
        lVar8 = 0;
        do {
          local_4c = 0;
          iVar4 = __isoc99_sscanf(*mem,",%15[^,\n ]%n",local_48,&local_4c);
          *mem = *mem + local_4c;
          if ((iVar4 != 1) || (local_4c < 1)) {
            load_param_mem();
            goto LAB_00133580;
          }
          bVar3 = vstr_is_float((char *)local_48);
          if (bVar3) {
            pcVar9 = "%f";
          }
          else {
            pcVar9 = "%d";
          }
          iVar4 = __isoc99_sscanf(local_48,pcVar9,(long)this->params[local_50].v.data + lVar11);
          if (iVar4 != 1) {
            load_param_mem();
            goto LAB_00133580;
          }
          lVar8 = lVar8 + 1;
          lVar11 = lVar11 + 4;
        } while (lVar8 < local_54);
      }
LAB_0013351c:
      this->params[local_50].loaded = 1;
      local_48[0] = 0;
      iVar4 = __isoc99_sscanf(*mem,"%d=%n",&local_50,local_48);
      pcVar9 = *mem + local_48[0];
      *mem = pcVar9;
      if (iVar4 != 1) {
        return 0;
      }
      if (local_48[0] < 1) {
        return 0;
      }
    }
    local_54 = 0;
    iVar4 = __isoc99_sscanf(pcVar9,"%15s%n",local_48,&local_54);
    *mem = *mem + local_54;
    if ((iVar4 == 1) && (0 < local_54)) {
      bVar3 = vstr_is_float((char *)local_48);
      pcVar9 = "%d";
      if (bVar3) {
        pcVar9 = "%f";
      }
      iVar4 = __isoc99_sscanf(local_48,pcVar9,&this->params[local_50].field_1);
      if (iVar4 == 1) goto LAB_0013351c;
      load_param_mem();
    }
    else {
      load_param_mem();
    }
LAB_00133580:
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int ParamDict::load_param_mem(const char*& mem){
    clear();

//     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (mem_sscanf(mem, "%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = mem_sscanf(mem, "%d", &len);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read array length fail\n");
                return -1;
            }

            params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = mem_sscanf(mem, ",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict read array element fail\n");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = params[id].v;
                    nscan = sscanf(vstr, "%f", &ptr[j]);
                }
                else
                {
                    int* ptr = params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                }
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict parse array element fail\n");
                    return -1;
                }
            }
        }
        else
        {
            char vstr[16];
            int nscan = mem_sscanf(mem, "%15s", vstr);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read value fail\n");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
                nscan = sscanf(vstr, "%f", &params[id].f);
            else
                nscan = sscanf(vstr, "%d", &params[id].i);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict parse value fail\n");
                return -1;
            }
        }

        params[id].loaded = 1;
    }
    return 0;
}